

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

bool __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *objectAddress,void *target)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  
  pRVar4 = HeapBucket::GetRecycler(this->heapBucket);
  bVar2 = HeapBlockMap64::IsAddressInNewChunk(&pRVar4->heapBlockMap,target);
  if (!bVar2) {
    if (((ulong)target & 0xf) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                         "HeapInfo::IsAlignedAddress(objectAddress)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    BVar3 = BVStatic<2048UL>::Test(this->markBits,(uint)((ulong)target >> 4) & 0x7ff);
    if (BVar3 == '\x01') {
      return true;
    }
    HeapBlock::PrintVerifyMarkFailure
              (this->heapBucket->heapInfo->recycler,(char *)objectAddress,(char *)target);
  }
  return false;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::VerifyMark(void * objectAddress, void * target)
{
    // Because we mark through new object, we might have a false reference
    // somewhere that we have scanned before this new block is allocated
    // so the object will not be marked even though it looks like a reference
    // Can't verify when the block is new
    if (this->heapBucket->GetRecycler()->heapBlockMap.IsAddressInNewChunk(target))
    {
        return false;
    }

    ushort bitIndex = GetAddressBitIndex(target);
    bool isMarked = this->GetMarkedBitVector()->Test(bitIndex) == TRUE;
#if DBG
    if (!isMarked)
    {
        PrintVerifyMarkFailure(this->GetRecycler(), (char*)objectAddress, (char*)target);
    }
#else
    if (!isMarked)
    {
        DebugBreak();
    }
#endif
    return isMarked;
}